

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O3

MPP_RET mpp_packet_deinit(MppPacket *packet)

{
  MppPacket pvVar1;
  MPP_RET MVar2;
  
  if ((packet != (MppPacket *)0x0) &&
     (MVar2 = check_is_mpp_packet_f(*packet,"mpp_packet_deinit"), MVar2 == MPP_OK)) {
    pvVar1 = *packet;
    if (*(MppBuffer *)((long)pvVar1 + 0x40) != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(*(MppBuffer *)((long)pvVar1 + 0x40),"mpp_packet_deinit");
    }
    if ((*(byte *)((long)pvVar1 + 0x3c) & 4) != 0) {
      mpp_osal_free("mpp_packet_deinit",*(void **)((long)pvVar1 + 8));
    }
    if (*(MppMeta *)((long)pvVar1 + 0x48) != (MppMeta)0x0) {
      mpp_meta_put(*(MppMeta *)((long)pvVar1 + 0x48));
    }
    if (*(void **)((long)pvVar1 + 0x120) != (void *)0x0) {
      mpp_osal_free("mpp_packet_deinit",*(void **)((long)pvVar1 + 0x120));
    }
    *(undefined8 *)((long)pvVar1 + 0x120) = 0;
    if (*(code **)((long)pvVar1 + 0x130) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x130))
                (*(undefined8 *)((long)pvVar1 + 0x138),*(undefined8 *)((long)pvVar1 + 0x140));
    }
    mpp_mem_pool_put_f("mpp_packet_deinit",mpp_packet_pool,*packet);
    *packet = (MppPacket)0x0;
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_packet","found NULL input\n","mpp_packet_deinit");
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET mpp_packet_deinit(MppPacket *packet)
{
    if (NULL == packet || check_is_mpp_packet(*packet)) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppPacketImpl *p = (MppPacketImpl *)(*packet);

    /* release buffer reference */
    if (p->buffer)
        mpp_buffer_put(p->buffer);

    if (p->flag & MPP_PACKET_FLAG_INTERNAL)
        mpp_free(p->data);

    if (p->meta)
        mpp_meta_put(p->meta);

    MPP_FREE(p->segments_ext);

    if (p->release)
        p->release(p->release_ctx, p->release_arg);

    mpp_mem_pool_put(mpp_packet_pool, *packet);
    *packet = NULL;
    return MPP_OK;
}